

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O1

void __thiscall
soul::SanityCheckPass::PostResolutionChecks::visit(PostResolutionChecks *this,Namespace *n)

{
  pointer ppVar1;
  Expression *pEVar2;
  VariableDeclaration *pVVar3;
  int iVar4;
  pool_ref<soul::AST::Function> *extraout_RDX;
  pointer ppVar5;
  ArrayView<soul::pool_ref<soul::AST::Function>_> functions;
  CompileMessage CStack_48;
  
  ASTVisitor::visit(&this->super_ASTVisitor,n);
  functions.e = extraout_RDX;
  functions.s = (n->functions).
                super__Vector_base<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  checkForDuplicateFunctions
            ((SanityCheckPass *)
             (n->functions).
             super__Vector_base<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
             ._M_impl.super__Vector_impl_data._M_start,functions);
  ppVar5 = (n->constants).
           super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (n->constants).
           super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (ppVar5 == ppVar1) {
      return;
    }
    if (ppVar5->object->isConstant != true) break;
    pEVar2 = (ppVar5->object->initialValue).object;
    if (pEVar2 != (Expression *)0x0) {
      iVar4 = (*(pEVar2->super_Statement).super_ASTObject._vptr_ASTObject[0xe])();
      if ((char)iVar4 == '\0') break;
    }
    ppVar5 = ppVar5 + 1;
  }
  pVVar3 = ppVar5->object;
  CompileMessageHelpers::createMessage<>
            (&CStack_48,syntax,error,"Only constant variables can be declared inside a namespace");
  AST::Context::throwError(&(pVVar3->super_Statement).super_ASTObject.context,&CStack_48,false);
}

Assistant:

void visit (AST::Namespace& n) override
        {
            super::visit (n);
            checkForDuplicateFunctions (n.functions);

            for (auto& v : n.constants)
                if (! v->isCompileTimeConstant())
                    v->context.throwError (Errors::nonConstInNamespace());
        }